

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O2

bool __thiscall GmmLib::GmmResourceInfoCommon::IsPresentableformat(GmmResourceInfoCommon *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GMM_PLATFORM_INFO *pGVar3;
  
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    pGVar3 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_00,iVar2));
    if (((this->Surf).Flags.Gpu.field_0x2 & 0x10) == 0) {
      return true;
    }
    GVar1 = (this->Surf).Format;
    if (GVar1 - GMM_FORMAT_A1B5G5R5_UNORM < 0x180) {
      return (~*(byte *)&pGVar3->FormatTable[GVar1].field_0 & 0xc) == 0;
    }
  }
  return false;
}

Assistant:

bool GmmLib::GmmResourceInfoCommon::IsPresentableformat()
{
    const GMM_PLATFORM_INFO *pPlatform;
    const GMM_FORMAT_ENTRY * FormatTable = NULL;

    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(GetGmmLibContext(), false);

    pPlatform   = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());
    FormatTable = &(pPlatform->FormatTable[0]);

    if(Surf.Flags.Gpu.Presentable == false)
    {
        // When Presentable flag is not set, no reason to check for valid RT
        // platform supported format. Safe to return true.
        return true;
    }

    if((Surf.Format > GMM_FORMAT_INVALID) &&
       (Surf.Format < GMM_RESOURCE_FORMATS))
    {
        if((FormatTable[Surf.Format].RenderTarget) &&
           (FormatTable[Surf.Format].Supported))
        {
            return true;
        }
        else
        {
            GMM_ASSERTDPF(0, "Present flag can only be set w/ a format!");
            return false;
        }
    }

    return false;
}